

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O0

void __thiscall nn::ESoinn::deleteNeuron(ESoinn *this,uint32_t number)

{
  ConcreteLogger *this_00;
  bool bVar1;
  reference pvVar2;
  AbstractWeightVector *pAVar3;
  size_type sVar4;
  uint local_50;
  uint32_t i;
  allocator local_39;
  string local_38;
  uint32_t local_14;
  ESoinn *pEStack_10;
  uint32_t number_local;
  ESoinn *this_local;
  
  this_00 = log_netw;
  local_14 = number;
  pEStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"deleteNeuron function",&local_39);
  logger::ConcreteLogger::debug(this_00,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pvVar2 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                     (&this->m_Neurons,(ulong)local_14);
  pAVar3 = neuron::AbstractNeuron::getWv(&pvVar2->super_AbstractNeuron);
  if (pAVar3 != (AbstractWeightVector *)0x0) {
    (*pAVar3->_vptr_AbstractWeightVector[7])();
  }
  pvVar2 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                     (&this->m_Neurons,(ulong)local_14);
  neuron::ESoinnNeuron::setDeleted(pvVar2);
  for (local_50 = 0;
      sVar4 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                        (&this->m_Neurons), local_50 < sVar4; local_50 = local_50 + 1) {
    pvVar2 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                       (&this->m_Neurons,(ulong)local_50);
    bVar1 = neuron::ESoinnNeuron::is_deleted(pvVar2);
    if (!bVar1) {
      pvVar2 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                         (&this->m_Neurons,(ulong)local_50);
      neuron::ESoinnNeuron::deleteConcreteNeighbour(pvVar2,local_14);
    }
  }
  return;
}

Assistant:

void ESoinn::deleteNeuron(uint32_t number)
    { 
        log_netw->debug("deleteNeuron function");
        //delete neuron with number
        delete m_Neurons[number].getWv();   
        m_Neurons[number].setDeleted();
        
        //delete all connections between other neurons and deleted neuron
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            m_Neurons[i].deleteConcreteNeighbour(number);    
        }    
    }